

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilter.h
# Opt level: O2

void __thiscall BlockFilter::Serialize<VectorWriter>(BlockFilter *this,VectorWriter *s)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ser_writedata8<VectorWriter>(s,this->m_filter_type);
  base_blob<256U>::Serialize<VectorWriter>(&(this->m_block_hash).super_base_blob<256U>,s);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    Serialize<VectorWriter,unsigned_char,std::allocator<unsigned_char>>
              (s,&(this->m_filter).m_encoded);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Serialize(Stream& s) const {
        s << static_cast<uint8_t>(m_filter_type)
          << m_block_hash
          << m_filter.GetEncoded();
    }